

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O0

void __thiscall
duckdb::ColumnScanState::Initialize
          (ColumnScanState *this,LogicalType *type,vector<duckdb::StorageIndex,_true> *children,
          optional_ptr<duckdb::TableScanOptions,_true> options)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  bool bVar3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_00;
  optional_ptr<duckdb::TableScanOptions,_true> options_00;
  ColumnScanState *this_01;
  LogicalType *pLVar4;
  size_type sVar5;
  reference pvVar6;
  TableScanOptions *in_RCX;
  LogicalType *in_RDX;
  ColumnScanState *in_RSI;
  TableScanOptions *in_RDI;
  vector<duckdb::StorageIndex,_true> *child_indexes;
  idx_t index;
  value_type *child;
  idx_t i_1;
  idx_t i;
  child_list_t<LogicalType> *struct_children;
  size_type in_stack_ffffffffffffff28;
  LogicalType *in_stack_ffffffffffffff30;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>
  *in_stack_ffffffffffffff50;
  LogicalType *in_stack_ffffffffffffff60;
  ColumnScanState *in_stack_ffffffffffffff68;
  optional_ptr<duckdb::TableScanOptions,_true> in_stack_ffffffffffffff70;
  reference local_68;
  vector<duckdb::StorageIndex,_true> *local_58;
  idx_t local_50;
  StorageIndex *local_48;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 __x;
  ulong uVar7;
  ulong uVar8;
  size_type in_stack_ffffffffffffffc8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffd0;
  LogicalType *type_00;
  LogicalType *pLVar9;
  optional_ptr<duckdb::TableScanOptions,_true> options_01;
  
  __x = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  *(TableScanOptions **)(in_RDI + 0x90) = in_RCX;
  options_01.ptr = in_RDI;
  LVar1 = LogicalType::id((LogicalType *)in_RSI);
  if (LVar1 != VALIDITY) {
    PVar2 = LogicalType::InternalType((LogicalType *)in_RSI);
    if (PVar2 == STRUCT) {
      this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)StructType::GetChildTypes_abi_cxx11_(in_stack_ffffffffffffff30);
      options_00.ptr = in_RDI + 0x28;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::size(this_00);
      ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      bVar3 = ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::empty
                        (in_stack_ffffffffffffff40);
      if (bVar3) {
        this_01 = (ColumnScanState *)(in_RDI + 0x68);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::size(this_00);
        std::vector<bool,_std::allocator<bool>_>::resize
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(bool)__x);
        type_00 = (LogicalType *)0x0;
        while (pLVar9 = type_00,
              pLVar4 = (LogicalType *)
                       ::std::
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                       ::size(this_00), type_00 < pLVar4) {
          vector<duckdb::ColumnScanState,_true>::operator[]
                    ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff28);
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                        *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          Initialize(this_01,type_00,options_00);
          type_00 = (LogicalType *)&pLVar9->physical_type_;
        }
      }
      else {
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::size(this_00);
        std::vector<bool,_std::allocator<bool>_>::resize
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(bool)__x);
        uVar7 = 0;
        while (uVar8 = uVar7,
              sVar5 = ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::
                      size((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
                           in_RDX), uVar7 < sVar5) {
          local_48 = vector<duckdb::StorageIndex,_true>::operator[]
                               ((vector<duckdb::StorageIndex,_true> *)in_stack_ffffffffffffff30,
                                in_stack_ffffffffffffff28);
          local_50 = StorageIndex::GetPrimaryIndex(local_48);
          local_58 = StorageIndex::GetChildIndexes(local_48);
          local_68 = vector<bool,_true>::operator[]
                               ((vector<bool,_true> *)in_stack_ffffffffffffff30,
                                in_stack_ffffffffffffff28);
          ::std::_Bit_reference::operator=((_Bit_reference *)&local_68,true);
          vector<duckdb::ColumnScanState,_true>::operator[]
                    ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff28);
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                        *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          Initialize(in_RSI,in_RDX,(vector<duckdb::StorageIndex,_true> *)this_00,options_01);
          uVar7 = uVar8 + 1;
        }
      }
      pvVar6 = vector<duckdb::ColumnScanState,_true>::operator[]
                         ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffff30,
                          in_stack_ffffffffffffff28);
      (pvVar6->scan_options).ptr = in_RCX;
    }
    else {
      PVar2 = LogicalType::InternalType((LogicalType *)in_RSI);
      if (PVar2 == LIST) {
        ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        vector<duckdb::ColumnScanState,_true>::operator[]
                  ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28);
        ListType::GetChildType(in_stack_ffffffffffffff30);
        Initialize(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff70);
        pvVar6 = vector<duckdb::ColumnScanState,_true>::operator[]
                           ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffff30,
                            in_stack_ffffffffffffff28);
        (pvVar6->scan_options).ptr = in_RCX;
      }
      else {
        PVar2 = LogicalType::InternalType((LogicalType *)in_RSI);
        if (PVar2 == ARRAY) {
          ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          pvVar6 = vector<duckdb::ColumnScanState,_true>::operator[]
                             ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffff30,
                              in_stack_ffffffffffffff28);
          (pvVar6->scan_options).ptr = in_RCX;
          pvVar6 = vector<duckdb::ColumnScanState,_true>::operator[]
                             ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffff30,
                              in_stack_ffffffffffffff28);
          ArrayType::GetChildType((LogicalType *)pvVar6);
          Initialize(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff70);
        }
        else {
          ::std::vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>::resize
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          pvVar6 = vector<duckdb::ColumnScanState,_true>::operator[]
                             ((vector<duckdb::ColumnScanState,_true> *)in_stack_ffffffffffffff30,
                              in_stack_ffffffffffffff28);
          (pvVar6->scan_options).ptr = in_RCX;
        }
      }
    }
  }
  return;
}

Assistant:

void ColumnScanState::Initialize(const LogicalType &type, const vector<StorageIndex> &children,
                                 optional_ptr<TableScanOptions> options) {
	// Register the options in the state
	scan_options = options;

	if (type.id() == LogicalTypeId::VALIDITY) {
		// validity - nothing to initialize
		return;
	}
	if (type.InternalType() == PhysicalType::STRUCT) {
		// validity + struct children
		auto &struct_children = StructType::GetChildTypes(type);
		child_states.resize(struct_children.size() + 1);

		if (children.empty()) {
			// scan all struct children
			scan_child_column.resize(struct_children.size(), true);
			for (idx_t i = 0; i < struct_children.size(); i++) {
				child_states[i + 1].Initialize(struct_children[i].second, options);
			}
		} else {
			// only scan the specified subset of columns
			scan_child_column.resize(struct_children.size(), false);
			for (idx_t i = 0; i < children.size(); i++) {
				auto &child = children[i];
				auto index = child.GetPrimaryIndex();
				auto &child_indexes = child.GetChildIndexes();
				scan_child_column[index] = true;
				child_states[index + 1].Initialize(struct_children[index].second, child_indexes, options);
			}
		}
		child_states[0].scan_options = options;
	} else if (type.InternalType() == PhysicalType::LIST) {
		// validity + list child
		child_states.resize(2);
		child_states[1].Initialize(ListType::GetChildType(type), options);
		child_states[0].scan_options = options;
	} else if (type.InternalType() == PhysicalType::ARRAY) {
		// validity + array child
		child_states.resize(2);
		child_states[0].scan_options = options;
		child_states[1].Initialize(ArrayType::GetChildType(type), options);
	} else {
		// validity
		child_states.resize(1);
		child_states[0].scan_options = options;
	}
}